

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_variablebyte.cpp
# Opt level: O0

void __thiscall
FastPForLib::VariableByteTest_sequenceHasBoth32And64_Test::
VariableByteTest_sequenceHasBoth32And64_Test(VariableByteTest_sequenceHasBoth32And64_Test *this)

{
  VariableByteTest *in_RDI;
  
  VariableByteTest::VariableByteTest(in_RDI);
  (in_RDI->super_Test)._vptr_Test =
       (_func_int **)&PTR__VariableByteTest_sequenceHasBoth32And64_Test_00341788;
  return;
}

Assistant:

TEST_F(VariableByteTest, sequenceHasBoth32And64) {
    in64.resize(0);
    in64.push_back(-9223372036854775000);
    in64.push_back(-32767);
    in64.push_back(-300);
    in64.push_back(0);
    in64.push_back(500);
    in64.push_back(32767);
    in64.push_back(65536);
    in64.push_back(2147483647);
    in64.push_back(4294967295);
    in64.push_back(8223372036854775800);
    _verify64();
  }